

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O1

bool __thiscall stream::slice_reader::open_file(slice_reader *this,path_type *file)

{
  ifstream *piVar1;
  logger *plVar2;
  long lVar3;
  long *plVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  ostream *poVar6;
  string *psVar7;
  size_type *psVar8;
  bool bVar9;
  ulong uVar10;
  char magic [8];
  char buffer [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [384];
  
  bVar9 = false;
  boost::filesystem::detail::status((path *)local_1b0,(error_code *)file);
  if (Info < (uint)local_1b0._0_4_) {
    if (logger::quiet == false) {
      local_1b0._0_4_ = 1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"Opening \"",9);
      plVar2 = logger::operator<<((logger *)local_1b0,(shell_command *)&color::cyan);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&plVar2->buffer,(file->m_pathname)._M_dataplus._M_p,
                 (file->m_pathname)._M_string_length);
      plVar2 = logger::operator<<(plVar2,(shell_command *)&color::reset);
      local_1d8._M_dataplus._M_p._0_1_ = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&plVar2->buffer,(char *)&local_1d8,1);
      logger::~logger((logger *)local_1b0);
    }
    piVar1 = &this->ifs;
    std::ifstream::close();
    bVar9 = false;
    std::ios::clear((int)(this->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                         super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]
                    + (int)piVar1);
    std::ifstream::open((char *)piVar1,(_Ios_Openmode)(file->m_pathname)._M_dataplus._M_p);
    if (((byte)((this->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3] + 0x20)
               [(long)&(this->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                       super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream] & 5)
        == 0) {
      lVar3 = std::istream::tellg();
      std::istream::seekg(piVar1,0,0);
      plVar4 = (long *)std::istream::read((char *)piVar1,(long)local_1b8);
      if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
        std::ifstream::close();
        psVar7 = (string *)__cxa_allocate_exception(0x20);
        std::operator+(&local_1d8,"could not read slice magic number in \"",&file->m_pathname);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d8);
        local_1b0._0_8_ = *plVar4;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_1b0._0_8_ == psVar8) {
          local_1b0._16_8_ = *psVar8;
          local_1b0._24_8_ = plVar4[3];
          local_1b0._0_8_ = local_1b0 + 0x10;
        }
        else {
          local_1b0._16_8_ = *psVar8;
        }
        local_1b0._8_8_ = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::ios_base::failure[abi:cxx11]::failure(psVar7);
        *(undefined ***)psVar7 = &PTR__failure_00173740;
        __cxa_throw(psVar7,&slice_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      std::istream::read((char *)piVar1,(long)local_1b0);
      uVar10 = local_1b0._0_8_ & 0xffffffff;
      this->slice_size = local_1b0._0_4_;
      if (((byte)((this->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                  super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3] + 0x20)
                 [(long)&(this->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                         super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream] & 5
          ) != 0) {
        std::ifstream::close();
        psVar7 = (string *)__cxa_allocate_exception(0x20);
        std::operator+(&local_1d8,"could not read slice size in \"",&file->m_pathname);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d8);
        local_1b0._0_8_ = *plVar4;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_1b0._0_8_ == psVar8) {
          local_1b0._16_8_ = *psVar8;
          local_1b0._24_8_ = plVar4[3];
          local_1b0._0_8_ = local_1b0 + 0x10;
        }
        else {
          local_1b0._16_8_ = *psVar8;
        }
        local_1b0._8_8_ = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::ios_base::failure[abi:cxx11]::failure(psVar7);
        *(undefined ***)psVar7 = &PTR__failure_00173740;
        __cxa_throw(psVar7,&slice_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      if (lVar3 < (long)uVar10) {
        std::ifstream::close();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"bad slice size in ",0x12);
        pbVar5 = boost::filesystem::operator<<
                           ((basic_ostream<char,_std::char_traits<char>_> *)local_1b0,file);
        std::__ostream_insert<char,std::char_traits<char>>(pbVar5,": ",2);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)pbVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," > ",3);
        std::ostream::_M_insert<long>((long)poVar6);
        psVar7 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        std::ios_base::failure[abi:cxx11]::failure(psVar7);
        *(undefined ***)psVar7 = &PTR__failure_00173740;
        __cxa_throw(psVar7,&slice_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      lVar3 = std::istream::tellg();
      if ((long)uVar10 < lVar3) {
        std::ifstream::close();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"bad slice size in ",0x12);
        pbVar5 = boost::filesystem::operator<<
                           ((basic_ostream<char,_std::char_traits<char>_> *)local_1b0,file);
        std::__ostream_insert<char,std::char_traits<char>>(pbVar5,": ",2);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)pbVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," < ",3);
        std::istream::tellg();
        std::ostream::_M_insert<long>((long)poVar6);
        psVar7 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        std::ios_base::failure[abi:cxx11]::failure(psVar7);
        *(undefined ***)psVar7 = &PTR__failure_00173740;
        __cxa_throw(psVar7,&slice_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      bVar9 = true;
    }
  }
  return bVar9;
}

Assistant:

bool slice_reader::open_file(const path_type & file) {
	
	if(!boost::filesystem::exists(file)) {
		return false;
	}
	
	log_info << "Opening \"" << color::cyan << file.string() << color::reset << '"';
	
	ifs.close();
	ifs.clear();
	
	ifs.open(file, std::ios_base::in | std::ios_base::binary | std::ios_base::ate);
	if(ifs.fail()) {
		return false;
	}
	
	std::streampos file_size = ifs.tellg();
	ifs.seekg(0);
	
	char magic[8];
	if(ifs.read(magic, 8).fail()) {
		ifs.close();
		throw slice_error("could not read slice magic number in \"" + file.string() + "\"");
	}
	bool found = false;
	for(size_t i = 0; boost::size(slice_ids); i++) {
		if(!std::memcmp(magic, slice_ids[i], 8)) {
			found = true;
			break;
		}
	}
	if(!found) {
		ifs.close();
		throw slice_error("bad slice magic number in \"" + file.string() + "\"");
	}
	
	slice_size = util::load<boost::uint32_t>(ifs);
	if(ifs.fail()) {
		ifs.close();
		throw slice_error("could not read slice size in \"" + file.string() + "\"");
	} else if(std::streampos(slice_size) > file_size) {
		ifs.close();
		std::ostringstream oss;
		oss << "bad slice size in " << file << ": " << slice_size << " > " << file_size;
		throw slice_error(oss.str());
	} else if(std::streampos(slice_size) < ifs.tellg()) {
		ifs.close();
		std::ostringstream oss;
		oss << "bad slice size in " << file << ": " << slice_size << " < " << ifs.tellg();
		throw slice_error(oss.str());
	}
	
	return true;
}